

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

char * __thiscall ASDCP::UMID::EncodeString(UMID *this,char *str_buf,ui32_t buf_len)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  char *__format;
  ulong uVar4;
  
  if (str_buf != (char *)0x0) {
    snprintf(str_buf,(ulong)buf_len,
             "[%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x],%02x,%02x,%02x,%02x,",
             (ulong)(this->super_Identifier<32U>).m_Value[0],
             (ulong)(this->super_Identifier<32U>).m_Value[1],
             (ulong)(this->super_Identifier<32U>).m_Value[2],
             (ulong)(this->super_Identifier<32U>).m_Value[3],
             (ulong)(this->super_Identifier<32U>).m_Value[4],
             (ulong)(this->super_Identifier<32U>).m_Value[5],
             (ulong)(this->super_Identifier<32U>).m_Value[6],
             (ulong)(this->super_Identifier<32U>).m_Value[7],
             (ulong)(this->super_Identifier<32U>).m_Value[8],
             (ulong)(this->super_Identifier<32U>).m_Value[9],
             (ulong)(this->super_Identifier<32U>).m_Value[10],
             (ulong)(this->super_Identifier<32U>).m_Value[0xb],
             (ulong)(this->super_Identifier<32U>).m_Value[0xc],
             (ulong)(this->super_Identifier<32U>).m_Value[0xd],
             (ulong)(this->super_Identifier<32U>).m_Value[0xe],
             (ulong)(this->super_Identifier<32U>).m_Value[0xf]);
    sVar2 = strlen(str_buf);
    bVar1 = (this->super_Identifier<32U>).m_Value[8];
    uVar4 = (ulong)(-1 < (char)bVar1);
    uVar3 = (ulong)(bVar1 >> 7);
    __format = "{%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x}";
    if (-1 < (char)bVar1) {
      __format = "[%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x]";
    }
    snprintf(str_buf + (sVar2 & 0xffffffff),(ulong)(buf_len - (int)sVar2),__format,
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x10],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x11],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x12],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x13],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x14],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x15],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x16],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar4 * 8 + 0x17],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x10],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x11],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x12],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x13],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x14],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x15],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x16],
             (ulong)(this->super_Identifier<32U>).m_Value[uVar3 * 8 + 0x17]);
    return str_buf;
  }
  __assert_fail("str_buf",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXFTypes.cpp"
                ,0xd8,"const char *ASDCP::UMID::EncodeString(char *, ui32_t) const");
}

Assistant:

const char*
ASDCP::UMID::EncodeString(char* str_buf, ui32_t buf_len) const
{
  assert(str_buf);

  snprintf(str_buf, buf_len, "[%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x],%02x,%02x,%02x,%02x,",
	   m_Value[0],  m_Value[1],  m_Value[2],  m_Value[3],
	   m_Value[4],  m_Value[5],  m_Value[6],  m_Value[7],
	   m_Value[8],  m_Value[9],  m_Value[10], m_Value[11],
	   m_Value[12], m_Value[13], m_Value[14], m_Value[15]
	   );

  ui32_t offset = strlen(str_buf);

  if ( ( m_Value[8] & 0x80 ) == 0 )
    {
      // half-swapped UL, use [bbaa9988.ddcc.ffee.00010203.04050607]
      snprintf(str_buf + offset, buf_len - offset,
	       "[%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x]",
               m_Value[24], m_Value[25], m_Value[26], m_Value[27],
	       m_Value[28], m_Value[29], m_Value[30], m_Value[31],
               m_Value[16], m_Value[17], m_Value[18], m_Value[19],
	       m_Value[20], m_Value[21], m_Value[22], m_Value[23]
               );
    }
  else
    {
      // UUID, use {00112233-4455-6677-8899-aabbccddeeff}
      snprintf(str_buf + offset, buf_len - offset,
	       "{%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x}",
               m_Value[16], m_Value[17], m_Value[18], m_Value[19],
	       m_Value[20], m_Value[21], m_Value[22], m_Value[23],
               m_Value[24], m_Value[25], m_Value[26], m_Value[27],
	       m_Value[28], m_Value[29], m_Value[30], m_Value[31]
               );
    }

  return str_buf;
}